

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPatternTools.cpp
# Opt level: O3

TPZAutoPointer<TPZRefPattern> __thiscall
TPZRefPatternTools::PerfectMatchRefPattern
          (TPZRefPatternTools *this,TPZGeoEl *gel,TPZVec<int> *sidestorefine)

{
  _List_node_base **pp_Var1;
  TPZVec<TPZVec<std::pair<int,_TPZTransform<double>_>_>_> *pTVar2;
  _List_node_base *p_Var3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  TPZGeoEl *pTVar8;
  _List_node_base *p_Var9;
  undefined8 *puVar10;
  TPZRefPattern *pTVar11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  ulong uVar14;
  TPZAutoPointer<TPZRefPattern> refpat;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> patlist;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> perfectmatch;
  TPZAutoPointer<TPZRefPattern> local_70;
  _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  local_68;
  TPZReference *local_50;
  _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
  local_48;
  
  if (gel == (TPZGeoEl *)0x0) {
    puVar10 = (undefined8 *)operator_new(0x10);
    *(undefined4 *)(puVar10 + 1) = 0;
    *puVar10 = 0;
    LOCK();
    *(undefined4 *)(puVar10 + 1) = 1;
    UNLOCK();
    *(undefined8 **)this = puVar10;
  }
  else {
    local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
    local_68._M_impl._M_node._M_size = 0;
    local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
    local_48._M_impl._M_node._M_size = 0;
    local_68._M_impl._M_node.super__List_node_base._M_prev =
         local_68._M_impl._M_node.super__List_node_base._M_next;
    local_50 = (TPZReference *)this;
    local_48._M_impl._M_node.super__List_node_base._M_prev =
         local_48._M_impl._M_node.super__List_node_base._M_next;
    GetCompatibleRefPatterns
              (gel,(list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                    *)local_68._M_impl._M_node.super__List_node_base._M_next);
    for (p_Var12 = local_68._M_impl._M_node.super__List_node_base._M_next;
        p_Var12 != (_List_node_base *)&local_68;
        p_Var12 = (((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                     *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      if ((p_Var12[1]._M_next != (_List_node_base *)0x0) &&
         (pTVar11 = (TPZRefPattern *)(p_Var12[1]._M_next)->_M_next, pTVar11 != (TPZRefPattern *)0x0)
         ) {
        pTVar8 = TPZRefPattern::Element(pTVar11,0);
        uVar4 = (**(code **)(*(long *)pTVar8 + 0x98))(pTVar8);
        uVar14 = (ulong)uVar4;
        iVar5 = (**(code **)(*(long *)pTVar8 + 0xf0))(pTVar8);
        iVar6 = (**(code **)(*(long *)pTVar8 + 0x210))(pTVar8);
        iVar5 = iVar5 - (uint)(iVar6 == 3);
        if ((int)uVar4 < iVar5) {
          uVar14 = (ulong)(int)uVar4;
          do {
            iVar6 = sidestorefine->fStore[uVar14];
            iVar7 = TPZRefPattern::NSideNodes
                              ((TPZRefPattern *)(p_Var12[1]._M_next)->_M_next,(int)uVar14);
            if (iVar6 != iVar7) goto LAB_010378f1;
            uVar14 = uVar14 + 1;
          } while ((long)iVar5 != uVar14);
        }
        else {
LAB_010378f1:
          if ((int)uVar14 != iVar5) goto LAB_0103791f;
        }
        p_Var9 = (_List_node_base *)operator_new(0x18);
        p_Var13 = p_Var12[1]._M_next;
        p_Var9[1]._M_next = p_Var13;
        LOCK();
        pp_Var1 = &p_Var13->_M_prev;
        *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
        UNLOCK();
        std::__detail::_List_node_base::_M_hook(p_Var9);
        local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
      }
LAB_0103791f:
    }
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&local_68);
    this = (TPZRefPatternTools *)local_50;
    local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
    local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
    local_68._M_impl._M_node._M_size = 0;
    if (local_48._M_impl._M_node._M_size == 0) {
      pTVar11 = (TPZRefPattern *)operator_new(0x10);
      *(undefined4 *)&(pTVar11->fSubElSideInfo)._vptr_TPZVec = 0;
      (pTVar11->super_TPZSavable)._vptr_TPZSavable = (_func_int **)0x0;
      LOCK();
      *(undefined4 *)&(pTVar11->fSubElSideInfo)._vptr_TPZVec = 1;
      UNLOCK();
      local_50->fPointer = pTVar11;
      this = (TPZRefPatternTools *)local_50;
    }
    else {
      p_Var12 = local_48._M_impl._M_node.super__List_node_base._M_next;
      if (local_48._M_impl._M_node._M_size != 1) {
        p_Var13 = (_List_node_base *)&local_68;
        if (local_48._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_48)
        {
LAB_01037a88:
          while (p_Var13 = p_Var13->_M_next, p_Var13 != (_List_node_base *)&local_68) {
            TPZGeoMesh::Print((TPZGeoMesh *)((p_Var13[1]._M_next)->_M_next + 0xb),
                              (ostream *)&std::cout);
          }
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Refine/TPZRefPatternTools.cpp"
                     ,0xf8);
        }
        iVar5 = 0x1e;
        do {
          local_70.fRef = (TPZReference *)p_Var12[1]._M_next;
          LOCK();
          *(int *)&((_List_node_base *)local_70.fRef)->_M_prev =
               *(int *)&((_List_node_base *)local_70.fRef)->_M_prev + 1;
          UNLOCK();
          iVar6 = TPZRefPattern::NSubElements
                            ((TPZRefPattern *)((_List_node_base *)local_70.fRef)->_M_next);
          if (iVar6 < iVar5) {
            iVar5 = TPZRefPattern::NSubElements((local_70.fRef)->fPointer);
            std::__cxx11::
            _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
            ::_M_clear(&local_68);
            local_68._M_impl._M_node._M_size = 0;
            local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
            local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
            p_Var9 = (_List_node_base *)operator_new(0x18);
LAB_01037a40:
            p_Var3 = p_Var12[1]._M_next;
            p_Var9[1]._M_next = p_Var3;
            LOCK();
            pp_Var1 = &p_Var3->_M_prev;
            *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
            UNLOCK();
            std::__detail::_List_node_base::_M_hook(p_Var9);
            local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
          }
          else {
            iVar6 = TPZRefPattern::NSubElements((local_70.fRef)->fPointer);
            if (iVar6 == iVar5) {
              p_Var9 = (_List_node_base *)operator_new(0x18);
              goto LAB_01037a40;
            }
          }
          TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_70);
          p_Var12 = (((_List_impl *)&p_Var12->_M_next)->_M_node).super__List_node_base._M_next;
        } while (p_Var12 != (_List_node_base *)&local_48);
        p_Var12 = local_68._M_impl._M_node.super__List_node_base._M_next;
        if (local_68._M_impl._M_node._M_size != 1) goto LAB_01037a88;
      }
      pTVar11 = (TPZRefPattern *)p_Var12[1]._M_next;
      ((TPZReference *)this)->fPointer = pTVar11;
      LOCK();
      pTVar2 = &pTVar11->fSubElSideInfo;
      *(int *)&pTVar2->_vptr_TPZVec = *(int *)&pTVar2->_vptr_TPZVec + 1;
      UNLOCK();
    }
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&local_48);
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&local_68);
  }
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZRefPatternTools::PerfectMatchRefPattern(TPZGeoEl *gel,
                                                                         TPZVec<int> &sidestorefine)
{
	if(!gel)
	{
		return NULL;
	}
	
	std::list<TPZAutoPointer<TPZRefPattern> > patlist, perfectmatch;
	TPZRefPatternTools::GetCompatibleRefPatterns(gel, patlist);
	
    // totototo
    //std::cout << "gel index " << gel->Index() << " sides " <<  sidestorefine << std::endl;
	std::list<TPZAutoPointer<TPZRefPattern> >::iterator it;
	for(it = patlist.begin(); it != patlist.end(); it++)
	{
		if( !(*it) )
		{
			continue;	
		}
		TPZGeoEl * gelTemp = (*it)->Element(0);
		int ncorners = gelTemp->NCornerNodes();
		int nsides = gelTemp->NSides();
		if(gelTemp->Dimension() == 3)
		{
			nsides--;
		}

		int is;
		for(is = ncorners; is < nsides; is++)
		{
			if( sidestorefine[is] != (*it)->NSideNodes(is) )
			{
				break;	
			}
		}
		if(is == nsides)
		{
            perfectmatch.push_back(*it);
		}
	}
    //std::cout << "perfect match size " << perfectmatch.size() << std::endl;
    
    patlist.clear();
    if (perfectmatch.size() == 1) {
        return *perfectmatch.begin();
    } else if(perfectmatch.size() > 1)
    {
        // return the refpattern with the least number of elements
        
        int minsubel = 30;
        for (auto it=perfectmatch.begin(); it!= perfectmatch.end(); it++) {
            TPZAutoPointer<TPZRefPattern> refpat = *it;
            if (refpat->NSubElements() < minsubel) {
                minsubel = refpat->NSubElements();
                patlist.clear();
                patlist.push_back(*it);
            }
            else if(refpat->NSubElements() == minsubel)
            {
                patlist.push_back(*it);
            }
        }
        if (patlist.size() != 1) {
            for (auto it2=patlist.begin(); it2 != patlist.end(); it2++) {
                (*it2)->fRefPatternMesh.Print();
            }
            DebugStop();
        }
        return *patlist.begin();
    }
    else
    {
        return NULL;
    }
}